

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O0

uint64_t dg::llvmutils::getConstantValue(Value *op)

{
  ret_type Limit;
  Value *this;
  ConstantInt *C;
  uint64_t size;
  
  this = Offset::UNKNOWN;
  Limit = llvm::dyn_cast<llvm::ConstantInt,llvm::Value_const>(Offset::UNKNOWN);
  if (Limit != (ret_type)0x0) {
    this = (Value *)llvm::ConstantInt::getLimitedValue((ConstantInt *)this,(uint64_t)Limit);
  }
  return (uint64_t)(ConstantInt *)this;
}

Assistant:

inline uint64_t getConstantValue(const llvm::Value *op) {
    using namespace llvm;

    // FIXME: we should get rid of this dependency
    static_assert(sizeof(Offset::type) == sizeof(uint64_t),
                  "The code relies on Offset::type having 8 bytes");

    uint64_t size = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(op)) {
        size = C->getLimitedValue();
    }

    // size is ~((uint64_t)0) if it is unknown
    return size;
}